

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_construct_destruct_withAllocator_valid_fn(int _i)

{
  int line;
  void *dynArray;
  char *pcVar1;
  char *expr;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  private_ACUtilsTest_ADynArray_freeCount = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  dynArray = private_ACUtils_ADynArray_constructWithAllocator
                       (1,private_ACUtilsTest_ADynArray_realloc,private_ACUtilsTest_ADynArray_free);
  sVar4 = *(size_t *)((long)dynArray + 0x18);
  if (sVar4 == 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x41);
    sVar4 = *(size_t *)((long)dynArray + 0x20);
    if (sVar4 == 8) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x42);
      if (*(long *)((long)dynArray + 0x28) == 0) {
        sVar4 = 0;
        pcVar5 = (char *)0x0;
        expr = "Assertion \'_ck_x != NULL\' failed";
        pcVar1 = "Assertion \'%s\' failed: %s == %#x";
        pcVar2 = "(void*) array->buffer != NULL";
        pcVar3 = "(void*) array->buffer";
        line = 0x43;
      }
      else {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x43);
        if (*(long *)((long)dynArray + 0x10) == 0) {
          sVar4 = 0;
          pcVar5 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %#x";
          pcVar2 = "(void*) array->growStrategy != NULL";
          pcVar3 = "(void*) array->growStrategy";
          line = 0x44;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x44);
          private_ACUtils_ADynArray_destruct(dynArray);
          if (private_ACUtilsTest_ADynArray_reallocCount == private_ACUtilsTest_ADynArray_freeCount)
          {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x46);
            return;
          }
          pcVar5 = "private_ACUtilsTest_ADynArray_freeCount";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar2 = 
          "private_ACUtilsTest_ADynArray_reallocCount == private_ACUtilsTest_ADynArray_freeCount";
          pcVar3 = "private_ACUtilsTest_ADynArray_reallocCount";
          line = 0x46;
          sVar4 = private_ACUtilsTest_ADynArray_reallocCount;
        }
      }
    }
    else {
      pcVar5 = "private_ACUtilsTest_ADynArray_capacityMin";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar2 = "array->capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar3 = "array->capacity";
      line = 0x42;
    }
  }
  else {
    pcVar5 = "0";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar2 = "array->size == 0";
    pcVar3 = "array->size";
    line = 0x41;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar1,pcVar2,pcVar3,sVar4,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_construct_destruct_withAllocator_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_freeCount = 0;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray, private_ACUtilsTest_ADynArray_realloc, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_UINT_EQ(array->size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array->capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->growStrategy);
    ADynArray_destruct(array);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, private_ACUtilsTest_ADynArray_freeCount);
}